

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

int av1_gop_is_second_arf(GF_GROUP *gf_group,int gf_frame_index)

{
  int arf_src_offset;
  int gf_frame_index_local;
  GF_GROUP *gf_group_local;
  int local_4;
  
  if ((gf_group->update_type[gf_frame_index] == '\x06') &&
     (6 < gf_group->arf_src_offset[gf_frame_index])) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_gop_is_second_arf(const GF_GROUP *gf_group, int gf_frame_index) {
  const int arf_src_offset = gf_group->arf_src_offset[gf_frame_index];
  // TODO(angiebird): when gf_group->size == 32, it's possble to
  // have "two" second arf. Check if this is acceptable.
  if (gf_group->update_type[gf_frame_index] == INTNL_ARF_UPDATE &&
      arf_src_offset >= TF_LOOKAHEAD_IDX_THR) {
    return 1;
  }
  return 0;
}